

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

void updateLtlStoreOfNtk(Abc_Ntk_t *pNtk,Vec_Ptr_t *tempLtlStore)

{
  int iVar1;
  void *Entry;
  char *pFormula;
  int i;
  Vec_Ptr_t *tempLtlStore_local;
  Abc_Ntk_t *pNtk_local;
  
  if (tempLtlStore == (Vec_Ptr_t *)0x0) {
    __assert_fail("tempLtlStore != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                  ,0xde,"void updateLtlStoreOfNtk(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  for (pFormula._4_4_ = 0; iVar1 = Vec_PtrSize(tempLtlStore), pFormula._4_4_ < iVar1;
      pFormula._4_4_ = pFormula._4_4_ + 1) {
    Entry = Vec_PtrEntry(tempLtlStore,pFormula._4_4_);
    Vec_PtrPush(pNtk->vLtlProperties,Entry);
  }
  return;
}

Assistant:

void updateLtlStoreOfNtk( Abc_Ntk_t *pNtk, Vec_Ptr_t *tempLtlStore )
{
    int i;
    char *pFormula;

    assert( tempLtlStore != NULL );
    Vec_PtrForEachEntry( char *, tempLtlStore, pFormula, i )
        Vec_PtrPush( pNtk->vLtlProperties, pFormula );
}